

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

void __thiscall
duckdb::ClientContext::InternalTryBindRelation
          (ClientContext *this,Relation *relation,
          vector<duckdb::ColumnDefinition,_true> *result_columns)

{
  type pBVar1;
  reference __args;
  reference __args_1;
  size_type __n;
  shared_ptr<duckdb::Binder,_true> binder;
  BoundStatement result;
  undefined1 local_70 [48];
  size_type local_40;
  size_type local_38;
  
  Binder::CreateBinder
            ((Binder *)local_70,this,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar1 = shared_ptr<duckdb::Binder,_true>::operator*((shared_ptr<duckdb::Binder,_true> *)local_70)
  ;
  (*relation->_vptr_Relation[4])(local_70 + 0x10,relation,pBVar1);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::reserve
            (&result_columns->
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>,
             ((long)(local_38 - local_40) >> 5) +
             ((long)(result_columns->
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ).
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result_columns->
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ).
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  if (local_38 != local_40) {
    __n = 0;
    do {
      __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)&local_40,__n);
      __args_1 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)(local_70 + 0x18),__n);
      ::std::vector<duckdb::ColumnDefinition,std::allocator<duckdb::ColumnDefinition>>::
      emplace_back<std::__cxx11::string&,duckdb::LogicalType&>
                ((vector<duckdb::ColumnDefinition,std::allocator<duckdb::ColumnDefinition>> *)
                 result_columns,__args,__args_1);
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_38 - local_40) >> 5));
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_70 + 0x18))
  ;
  if ((ClientContext *)local_70._16_8_ != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_70._16_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  return;
}

Assistant:

void ClientContext::InternalTryBindRelation(Relation &relation, vector<ColumnDefinition> &result_columns) {
	// bind the expressions
	auto binder = Binder::CreateBinder(*this);
	auto result = relation.Bind(*binder);
	D_ASSERT(result.names.size() == result.types.size());

	result_columns.reserve(result_columns.size() + result.names.size());
	for (idx_t i = 0; i < result.names.size(); i++) {
		result_columns.emplace_back(result.names[i], result.types[i]);
	}
}